

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_RUNES_OF_EVIL(effect_handler_context_t_conflict *context)

{
  anon_enum_32 aVar1;
  player *ppVar2;
  _Bool _Var3;
  uint32_t uVar4;
  wchar_t wVar5;
  char *dice_string;
  anon_union_8_5_62f3dbed_for_which aVar6;
  wchar_t radius;
  int iVar7;
  source origin;
  source origin_00;
  source origin_01;
  source origin_02;
  source origin_03;
  wchar_t wVar8;
  
  uVar4 = Rand_div(3);
  iVar7 = uVar4 + 4;
  do {
    if (iVar7 < 1) {
      return false;
    }
    if (context->obj->pval * 2 < (player->state).skills[3]) {
      uVar4 = Rand_div(6);
      ppVar2 = player;
      if (uVar4 == 0) {
        wVar5 = damroll(5,0x14);
        take_hit(ppVar2,wVar5,"a chest dispel-player trap");
      }
      else {
        uVar4 = Rand_div(5);
        if (uVar4 == 0) {
          player_inc_timed(player,L'\b',L'È',true,true,true);
        }
        else {
          uVar4 = Rand_div(4);
          if (uVar4 == 0) {
            _Var3 = player_of_has(player,L'\x0f');
            ppVar2 = player;
            if (_Var3) {
              uVar4 = Rand_div(100);
              wVar5 = uVar4 + L'\n';
              wVar8 = L'\t';
            }
            else {
              uVar4 = Rand_div(6);
              wVar5 = uVar4 + L'\x02';
              wVar8 = L'\x03';
            }
            player_inc_timed(ppVar2,wVar8,wVar5,true,true,true);
          }
          else {
            uVar4 = Rand_div(3);
            if (uVar4 == 0) {
              aVar1 = (context->origin).what;
              aVar6 = (anon_union_8_5_62f3dbed_for_which)(context->origin).which.trap;
              wVar5 = L'0';
              wVar8 = L'\0';
LAB_0014022c:
              origin._0_8_ = (ulong)aVar1;
              dice_string = "0";
              radius = L'\0';
            }
            else {
              uVar4 = Rand_div(2);
              origin._0_8_ = CONCAT44(0,(context->origin).what);
              aVar6 = (anon_union_8_5_62f3dbed_for_which)(context->origin).which.trap;
              if (uVar4 == 0) {
                origin.which.trap = aVar6.trap;
                effect_simple(L'\x11',origin,"0",L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
                origin_00._4_4_ = 0;
                origin_00.what = (context->origin).what;
                wVar5 = L'\x11';
                origin_00.which.trap = (context->origin).which.trap;
                effect_simple(L'\x11',origin_00,"0",L'\x01',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
                origin_01._4_4_ = 0;
                origin_01.what = (context->origin).what;
                origin_01.which.trap = (context->origin).which.trap;
                effect_simple(L'\x11',origin_01,"0",L'\x02',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
                origin_02._4_4_ = 0;
                origin_02.what = (context->origin).what;
                origin_02.which.trap = (context->origin).which.trap;
                effect_simple(L'\x11',origin_02,"0",L'\x03',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
                aVar1 = (context->origin).what;
                aVar6 = (anon_union_8_5_62f3dbed_for_which)(context->origin).which.trap;
                wVar8 = L'\x04';
                goto LAB_0014022c;
              }
              wVar5 = L'M';
              dice_string = "150";
              wVar8 = L'\n';
              radius = L'\x01';
            }
            origin_03.which.trap = aVar6.trap;
            origin_03._0_8_ = origin._0_8_;
            effect_simple(wVar5,origin_03,dice_string,wVar8,radius,L'\0',L'\0',L'\0',(_Bool *)0x0);
          }
        }
      }
    }
    iVar7 = iVar7 + -1;
  } while( true );
}

Assistant:

bool effect_handler_RUNES_OF_EVIL(effect_handler_context_t *context)
{
	/* Determine how many nasty tricks can be played. */
	int nasty_tricks_count = 4 + randint0(3);

	/* This is gonna hurt... */
	for (; nasty_tricks_count > 0; nasty_tricks_count--) {
		/* ...but a high saving throw does help a little. */
		if (2 * context->obj->pval < player->state.skills[SKILL_SAVE]) {
			if (one_in_(6)) {
				take_hit(player, damroll(5, 20), "a chest dispel-player trap");
			} else if (one_in_(5)) {
				player_inc_timed(player, TMD_CUT, 200, true, true, true);
			} else if (one_in_(4)) {
				if (!player_of_has(player, OF_FREE_ACT)) {
					player_inc_timed(player, TMD_PARALYZED, 2 + randint0(6),
									 true, true, true);
				} else {
					player_inc_timed(player, TMD_STUN, 10 + randint0(100),
									 true, true, true);
				}
			} else if (one_in_(3)) {
				effect_simple(EF_DISENCHANT, context->origin, "0", 0, 0, 0, 0, 0, NULL);
			} else if (one_in_(2)) {
				effect_simple(EF_DRAIN_STAT, context->origin, "0", STAT_STR, 0, 0, 0, 0, NULL);
				effect_simple(EF_DRAIN_STAT, context->origin, "0", STAT_INT, 0, 0, 0, 0, NULL);
				effect_simple(EF_DRAIN_STAT, context->origin, "0", STAT_WIS, 0, 0, 0, 0, NULL);
				effect_simple(EF_DRAIN_STAT, context->origin, "0", STAT_DEX, 0, 0, 0, 0, NULL);
				effect_simple(EF_DRAIN_STAT, context->origin, "0", STAT_CON, 0, 0, 0, 0, NULL);
			} else {
				effect_simple(EF_CLOUD, context->origin, "150", PROJ_NETHER, 1, 0, 0, 0, NULL);
			}
		}
	}

	return false;
}